

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O1

int ov_fopen(char *path,OggVorbis_File *vf)

{
  int iVar1;
  FILE *__stream;
  
  __stream = fopen(path,"rb");
  if (__stream == (FILE *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = ov_open((FILE *)__stream,vf,(char *)0x0,0);
    if (iVar1 != 0) {
      fclose(__stream);
    }
  }
  return iVar1;
}

Assistant:

int ov_fopen(const char *path,OggVorbis_File *vf){
  int ret;
  FILE *f = fopen(path,"rb");
  if(!f) return -1;

  ret = ov_open(f,vf,NULL,0);
  if(ret) fclose(f);
  return ret;
}